

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect.cpp
# Opt level: O3

void LoadReverbPreset(char *name,ALeffect *effect)

{
  undefined8 uVar1;
  int iVar2;
  uint type;
  char *__format;
  long lVar3;
  
  iVar2 = al::strcasecmp(name,"NONE");
  if (iVar2 == 0) {
    anon_unknown.dwarf_25011::InitEffectParams(effect,0);
    if ((int)gLogLevel < 3) {
      return;
    }
    __format = "[ALSOFT] (II) Loading reverb \'%s\'\n";
    name = "NONE";
  }
  else {
    type = 0x8000;
    if (DisabledEffects[0] != false) {
      type = DisabledEffects[1] ^ 1;
    }
    anon_unknown.dwarf_25011::InitEffectParams(effect,type);
    lVar3 = 0;
    do {
      iVar2 = al::strcasecmp(name,reverblist[0].name + lVar3);
      if (iVar2 == 0) {
        if (2 < (int)gLogLevel) {
          fprintf((FILE *)gLogFile,"[ALSOFT] (II) Loading reverb \'%s\'\n",
                  reverblist[0].name + lVar3);
        }
        uVar1 = *(undefined8 *)((long)reverblist[0].props.flReflectionsPan + lVar3 + -0x20);
        (effect->Props).Pshifter =
             *(anon_struct_8_2_6e933c48_for_Pshifter *)
              ((long)reverblist[0].props.flReflectionsPan + lVar3 + -0x28);
        *(undefined8 *)((long)&effect->Props + 8) = uVar1;
        (effect->Props).Reverb.GainLF =
             *(float *)((long)reverblist[0].props.flReflectionsPan + lVar3 + -0x18);
        *(undefined8 *)((long)&effect->Props + 0x10) =
             *(undefined8 *)((long)reverblist[0].props.flReflectionsPan + lVar3 + -0x14);
        (effect->Props).Reverb.DecayLFRatio =
             *(float *)((long)reverblist[0].props.flReflectionsPan + lVar3 + -0xc);
        *(undefined8 *)((long)&effect->Props + 0x18) =
             *(undefined8 *)((long)reverblist[0].props.flReflectionsPan + lVar3 + -8);
        *(undefined8 *)((long)&effect->Props + 0x3c) =
             *(undefined8 *)((long)reverblist[0].props.flReflectionsPan + lVar3);
        (effect->Props).Reverb.ReflectionsPan[2] =
             *(float *)((long)reverblist[0].props.flReflectionsPan + lVar3 + 8);
        *(undefined8 *)((long)&effect->Props + 0x20) =
             *(undefined8 *)((long)reverblist[0].props.flLateReverbPan + lVar3 + -8);
        uVar1 = *(undefined8 *)((long)reverblist[0].props.flLateReverbPan + lVar3 + 8);
        *(undefined8 *)((long)&effect->Props + 0x48) =
             *(undefined8 *)((long)reverblist[0].props.flLateReverbPan + lVar3);
        *(undefined8 *)((long)&effect->Props + 0x50) = uVar1;
        *(undefined8 *)((long)&effect->Props + 0x58) =
             *(undefined8 *)((long)reverblist[0].props.flLateReverbPan + lVar3 + 0x10);
        (effect->Props).Reverb.ModulationDepth =
             *(float *)((long)reverblist[0].props.flLateReverbPan + lVar3 + 0x18);
        (effect->Props).Reverb.AirAbsorptionGainHF =
             *(float *)((long)reverblist[0].props.flLateReverbPan + lVar3 + 0x1c);
        *(undefined8 *)((long)&effect->Props + 100) =
             *(undefined8 *)((long)reverblist[0].props.flLateReverbPan + lVar3 + 0x20);
        (effect->Props).Reverb.RoomRolloffFactor =
             *(float *)((long)reverblist[0].props.flLateReverbPan + lVar3 + 0x28);
        (effect->Props).Reverb.DecayHFLimit =
             *(int *)((long)reverblist[0].props.flLateReverbPan + lVar3 + 0x2c) != 0;
        return;
      }
      lVar3 = lVar3 + 0x8c;
    } while (lVar3 != 0x3dcc);
    if ((int)gLogLevel < 2) {
      return;
    }
    __format = "[ALSOFT] (WW) Reverb preset \'%s\' not found\n";
  }
  fprintf((FILE *)gLogFile,__format,name);
  return;
}

Assistant:

void LoadReverbPreset(const char *name, ALeffect *effect)
{
    if(al::strcasecmp(name, "NONE") == 0)
    {
        InitEffectParams(effect, AL_EFFECT_NULL);
        TRACE("Loading reverb '%s'\n", "NONE");
        return;
    }

    if(!DisabledEffects[EAXREVERB_EFFECT])
        InitEffectParams(effect, AL_EFFECT_EAXREVERB);
    else if(!DisabledEffects[REVERB_EFFECT])
        InitEffectParams(effect, AL_EFFECT_REVERB);
    else
        InitEffectParams(effect, AL_EFFECT_NULL);
    for(const auto &reverbitem : reverblist)
    {
        const EFXEAXREVERBPROPERTIES *props;

        if(al::strcasecmp(name, reverbitem.name) != 0)
            continue;

        TRACE("Loading reverb '%s'\n", reverbitem.name);
        props = &reverbitem.props;
        effect->Props.Reverb.Density   = props->flDensity;
        effect->Props.Reverb.Diffusion = props->flDiffusion;
        effect->Props.Reverb.Gain   = props->flGain;
        effect->Props.Reverb.GainHF = props->flGainHF;
        effect->Props.Reverb.GainLF = props->flGainLF;
        effect->Props.Reverb.DecayTime    = props->flDecayTime;
        effect->Props.Reverb.DecayHFRatio = props->flDecayHFRatio;
        effect->Props.Reverb.DecayLFRatio = props->flDecayLFRatio;
        effect->Props.Reverb.ReflectionsGain   = props->flReflectionsGain;
        effect->Props.Reverb.ReflectionsDelay  = props->flReflectionsDelay;
        effect->Props.Reverb.ReflectionsPan[0] = props->flReflectionsPan[0];
        effect->Props.Reverb.ReflectionsPan[1] = props->flReflectionsPan[1];
        effect->Props.Reverb.ReflectionsPan[2] = props->flReflectionsPan[2];
        effect->Props.Reverb.LateReverbGain   = props->flLateReverbGain;
        effect->Props.Reverb.LateReverbDelay  = props->flLateReverbDelay;
        effect->Props.Reverb.LateReverbPan[0] = props->flLateReverbPan[0];
        effect->Props.Reverb.LateReverbPan[1] = props->flLateReverbPan[1];
        effect->Props.Reverb.LateReverbPan[2] = props->flLateReverbPan[2];
        effect->Props.Reverb.EchoTime  = props->flEchoTime;
        effect->Props.Reverb.EchoDepth = props->flEchoDepth;
        effect->Props.Reverb.ModulationTime  = props->flModulationTime;
        effect->Props.Reverb.ModulationDepth = props->flModulationDepth;
        effect->Props.Reverb.AirAbsorptionGainHF = props->flAirAbsorptionGainHF;
        effect->Props.Reverb.HFReference = props->flHFReference;
        effect->Props.Reverb.LFReference = props->flLFReference;
        effect->Props.Reverb.RoomRolloffFactor = props->flRoomRolloffFactor;
        effect->Props.Reverb.DecayHFLimit = props->iDecayHFLimit ? AL_TRUE : AL_FALSE;
        return;
    }

    WARN("Reverb preset '%s' not found\n", name);
}